

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cc
# Opt level: O0

string * __thiscall muduo::Date::toIsoString_abi_cxx11_(Date *this)

{
  ulong uVar1;
  ulong uVar2;
  string *in_RDI;
  ulong uVar3;
  YearMonthDay YVar4;
  YearMonthDay ymd;
  char buf [32];
  Date *in_stack_ffffffffffffff80;
  char *__s;
  allocator local_59;
  YearMonthDay local_58;
  ulong local_48;
  uint local_40;
  char local_38 [56];
  
  YVar4 = yearMonthDay(in_stack_ffffffffffffff80);
  local_58.day = YVar4.day;
  local_40 = local_58.day;
  local_58._0_8_ = YVar4._0_8_;
  local_48._0_4_ = local_58.year;
  local_48._4_4_ = local_58.month;
  uVar2 = local_58._0_8_ & 0xffffffff;
  uVar1 = (ulong)local_58._0_8_ >> 0x20;
  uVar3 = (ulong)(uint)local_58.day;
  __s = local_38;
  local_58 = YVar4;
  snprintf(__s,0x20,"%4d-%02d-%02d",uVar2,uVar1,uVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,__s,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return in_RDI;
}

Assistant:

string Date::toIsoString() const
{
  char buf[32];
  YearMonthDay ymd(yearMonthDay());
  snprintf(buf, sizeof buf, "%4d-%02d-%02d", ymd.year, ymd.month, ymd.day);
  return buf;
}